

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::CompletePropertyDescriptor
               (PropertyDescriptor *resultDescriptor,PropertyDescriptor *likeDescriptor,
               ScriptContext *requestContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  Var pvVar2;
  PropertyDescriptor *local_28;
  PropertyDescriptor *likePropertyDescriptor;
  ScriptContext *requestContext_local;
  PropertyDescriptor *likeDescriptor_local;
  PropertyDescriptor *resultDescriptor_local;
  
  local_28 = likeDescriptor;
  if (likeDescriptor == (PropertyDescriptor *)0x0) {
    this = ScriptContext::GetLibrary(requestContext);
    local_28 = JavascriptLibrary::GetDefaultPropertyDescriptor(this);
  }
  bVar1 = PropertyDescriptor::IsDataDescriptor(resultDescriptor);
  if ((bVar1) || (bVar1 = PropertyDescriptor::IsGenericDescriptor(resultDescriptor), bVar1)) {
    bVar1 = PropertyDescriptor::ValueSpecified(resultDescriptor);
    if (!bVar1) {
      pvVar2 = PropertyDescriptor::GetValue(local_28);
      PropertyDescriptor::SetValue(resultDescriptor,pvVar2);
    }
    bVar1 = PropertyDescriptor::WritableSpecified(resultDescriptor);
    if (!bVar1) {
      bVar1 = PropertyDescriptor::IsWritable(local_28);
      PropertyDescriptor::SetWritable(resultDescriptor,bVar1);
    }
  }
  else {
    bVar1 = PropertyDescriptor::GetterSpecified(resultDescriptor);
    if (!bVar1) {
      pvVar2 = PropertyDescriptor::GetGetter(local_28);
      PropertyDescriptor::SetGetter(resultDescriptor,pvVar2);
    }
    bVar1 = PropertyDescriptor::SetterSpecified(resultDescriptor);
    if (!bVar1) {
      pvVar2 = PropertyDescriptor::GetSetter(local_28);
      PropertyDescriptor::SetSetter(resultDescriptor,pvVar2);
    }
  }
  bVar1 = PropertyDescriptor::EnumerableSpecified(resultDescriptor);
  if (!bVar1) {
    bVar1 = PropertyDescriptor::IsEnumerable(local_28);
    PropertyDescriptor::SetEnumerable(resultDescriptor,bVar1);
  }
  bVar1 = PropertyDescriptor::ConfigurableSpecified(resultDescriptor);
  if (!bVar1) {
    bVar1 = PropertyDescriptor::IsConfigurable(local_28);
    PropertyDescriptor::SetConfigurable(resultDescriptor,bVar1);
  }
  return;
}

Assistant:

void JavascriptOperators::CompletePropertyDescriptor(PropertyDescriptor* resultDescriptor, PropertyDescriptor* likeDescriptor, ScriptContext* requestContext)
    {
        const PropertyDescriptor* likePropertyDescriptor = likeDescriptor;
        //    1. Assert: LikeDesc is either a Property Descriptor or undefined.
        //    2. ReturnIfAbrupt(Desc).
        //    3. Assert : Desc is a Property Descriptor
        //    4. If LikeDesc is undefined, then set LikeDesc to Record{ [[Value]]: undefined, [[Writable]] : false, [[Get]] : undefined, [[Set]] : undefined, [[Enumerable]] : false, [[Configurable]] : false }.
        if (likePropertyDescriptor == nullptr)
        {
            likePropertyDescriptor = requestContext->GetLibrary()->GetDefaultPropertyDescriptor();
        }
        //    5. If either IsGenericDescriptor(Desc) or IsDataDescriptor(Desc) is true, then
        if (resultDescriptor->IsDataDescriptor() || resultDescriptor->IsGenericDescriptor())
        {
            //    a.If Desc does not have a[[Value]] field, then set Desc.[[Value]] to LikeDesc.[[Value]].
            //    b.If Desc does not have a[[Writable]] field, then set Desc.[[Writable]] to LikeDesc.[[Writable]].
            if (!resultDescriptor->ValueSpecified())
            {
                resultDescriptor->SetValue(likePropertyDescriptor->GetValue());
            }
            if (!resultDescriptor->WritableSpecified())
            {
                resultDescriptor->SetWritable(likePropertyDescriptor->IsWritable());
            }
        }
        else
        {
            //    6. Else,
            //    a.If Desc does not have a[[Get]] field, then set Desc.[[Get]] to LikeDesc.[[Get]].
            //    b.If Desc does not have a[[Set]] field, then set Desc.[[Set]] to LikeDesc.[[Set]].
            if (!resultDescriptor->GetterSpecified())
            {
                resultDescriptor->SetGetter(likePropertyDescriptor->GetGetter());
            }
            if (!resultDescriptor->SetterSpecified())
            {
                resultDescriptor->SetSetter(likePropertyDescriptor->GetSetter());
            }
        }
        //    7. If Desc does not have an[[Enumerable]] field, then set Desc.[[Enumerable]] to LikeDesc.[[Enumerable]].
        //    8. If Desc does not have a[[Configurable]] field, then set Desc.[[Configurable]] to LikeDesc.[[Configurable]].
        //    9. Return Desc.
        if (!resultDescriptor->EnumerableSpecified())
        {
            resultDescriptor->SetEnumerable(likePropertyDescriptor->IsEnumerable());
        }
        if (!resultDescriptor->ConfigurableSpecified())
        {
            resultDescriptor->SetConfigurable(likePropertyDescriptor->IsConfigurable());
        }
    }